

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O0

void __thiscall
TPZInterpolationSpace::ComputeSolution
          (TPZInterpolationSpace *this,TPZVec<double> *qsi,TPZMaterialDataT<double> *data,
          bool hasPhi)

{
  byte in_CL;
  long in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  
  if ((in_CL & 1) == 0) {
    (**(code **)(*in_RDI + 0x298))(in_RDI,in_RDX);
    *(undefined1 *)(in_RDX + 0x38f8) = 1;
    (**(code **)(*in_RDI + 0x2a8))(in_RDI,in_RDX,in_RSI);
  }
  else {
    (**(code **)(*in_RDI + 0x300))(in_RDI,in_RDX);
  }
  return;
}

Assistant:

void TPZInterpolationSpace::ComputeSolution(TPZVec<REAL> &qsi,
									TPZMaterialDataT<STATE> &data,
									bool hasPhi){
	if(hasPhi){
		this->ReallyComputeSolution(data);
	}else{
		this->InitMaterialData(data);
		data.fNeedsSol=true;
		this->ComputeRequiredData(data,qsi);
	}
}